

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ClientImpl::copy_settings(ClientImpl *this,ClientImpl *rhs)

{
  long in_RSI;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x128),(string *)(in_RSI + 0x128));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x148),(string *)(in_RSI + 0x148));
  *(undefined8 *)(in_RDI + 0x168) = *(undefined8 *)(in_RSI + 0x168);
  *(undefined8 *)(in_RDI + 0x178) = *(undefined8 *)(in_RSI + 0x178);
  *(undefined8 *)(in_RDI + 0x180) = *(undefined8 *)(in_RSI + 0x180);
  *(undefined8 *)(in_RDI + 0x188) = *(undefined8 *)(in_RSI + 0x188);
  *(undefined8 *)(in_RDI + 400) = *(undefined8 *)(in_RSI + 400);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x198),(string *)(in_RSI + 0x198));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1b8),(string *)(in_RSI + 0x1b8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1d8),(string *)(in_RSI + 0x1d8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1f8),(string *)(in_RSI + 0x1f8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x218),(string *)(in_RSI + 0x218));
  *(byte *)(in_RDI + 0x238) = *(byte *)(in_RSI + 0x238) & 1;
  *(byte *)(in_RDI + 0x239) = *(byte *)(in_RSI + 0x239) & 1;
  *(byte *)(in_RDI + 0x23a) = *(byte *)(in_RSI + 0x23a) & 1;
  *(undefined4 *)(in_RDI + 0x23c) = *(undefined4 *)(in_RSI + 0x23c);
  *(byte *)(in_RDI + 0x240) = *(byte *)(in_RSI + 0x240) & 1;
  std::function<void_(int)>::operator=((function<void_(int)> *)this,(function<void_(int)> *)rhs);
  *(byte *)(in_RDI + 0x268) = *(byte *)(in_RSI + 0x268) & 1;
  *(byte *)(in_RDI + 0x269) = *(byte *)(in_RSI + 0x269) & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x270),(string *)(in_RSI + 0x270));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x290),(string *)(in_RSI + 0x290));
  *(undefined4 *)(in_RDI + 0x2b0) = *(undefined4 *)(in_RSI + 0x2b0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2b8),(string *)(in_RSI + 0x2b8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2d8),(string *)(in_RSI + 0x2d8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2f8),(string *)(in_RSI + 0x2f8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x318),(string *)(in_RSI + 0x318));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x338),(string *)(in_RSI + 0x338));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x358),(string *)(in_RSI + 0x358));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x378),(string *)(in_RSI + 0x378));
  *(undefined8 *)(in_RDI + 0x398) = *(undefined8 *)(in_RSI + 0x398);
  *(byte *)(in_RDI + 0x3a0) = *(byte *)(in_RSI + 0x3a0) & 1;
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator=
            ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)this,
             (function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)rhs);
  return;
}

Assistant:

inline void ClientImpl::copy_settings(const ClientImpl& rhs) {
        client_cert_path_ = rhs.client_cert_path_;
        client_key_path_ = rhs.client_key_path_;
        connection_timeout_sec_ = rhs.connection_timeout_sec_;
        read_timeout_sec_ = rhs.read_timeout_sec_;
        read_timeout_usec_ = rhs.read_timeout_usec_;
        write_timeout_sec_ = rhs.write_timeout_sec_;
        write_timeout_usec_ = rhs.write_timeout_usec_;
        basic_auth_username_ = rhs.basic_auth_username_;
        basic_auth_password_ = rhs.basic_auth_password_;
        bearer_token_auth_token_ = rhs.bearer_token_auth_token_;
    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        digest_auth_username_ = rhs.digest_auth_username_;
        digest_auth_password_ = rhs.digest_auth_password_;
    #endif
        keep_alive_ = rhs.keep_alive_;
        follow_location_ = rhs.follow_location_;
        url_encode_ = rhs.url_encode_;
        address_family_ = rhs.address_family_;
        tcp_nodelay_ = rhs.tcp_nodelay_;
        socket_options_ = rhs.socket_options_;
        compress_ = rhs.compress_;
        decompress_ = rhs.decompress_;
        interface_ = rhs.interface_;
        proxy_host_ = rhs.proxy_host_;
        proxy_port_ = rhs.proxy_port_;
        proxy_basic_auth_username_ = rhs.proxy_basic_auth_username_;
        proxy_basic_auth_password_ = rhs.proxy_basic_auth_password_;
        proxy_bearer_token_auth_token_ = rhs.proxy_bearer_token_auth_token_;
    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        proxy_digest_auth_username_ = rhs.proxy_digest_auth_username_;
        proxy_digest_auth_password_ = rhs.proxy_digest_auth_password_;
    #endif
    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        ca_cert_file_path_ = rhs.ca_cert_file_path_;
        ca_cert_dir_path_ = rhs.ca_cert_dir_path_;
        ca_cert_store_ = rhs.ca_cert_store_;
    #endif
    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        server_certificate_verification_ = rhs.server_certificate_verification_;
    #endif
        logger_ = rhs.logger_;
    }